

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas2.c
# Opt level: O2

int sp_strsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,float *x,
            SuperLUStat_t *stat,int *info)

{
  real *a;
  int iVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  SuperMatrix *pSVar13;
  SuperMatrix *pSVar14;
  float *pfVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  float fVar20;
  int nsupc;
  char *local_170;
  SuperMatrix *local_168;
  SuperMatrix *local_160;
  float *local_158;
  int incx;
  int local_14c;
  long local_148;
  long local_140;
  int nsupr;
  
  incx = 1;
  *info = 0;
  if ((*uplo == 'U') || (*uplo == 'L')) {
    iVar18 = 2;
    iVar17 = -2;
    if (((byte)*trans - 0x43 < 0x12) && ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) != 0)) {
      if ((*diag == 'U') || (*diag == 'N')) {
        iVar1 = L->nrow;
        iVar18 = 4;
        iVar17 = -4;
        if ((-1 < (long)iVar1) && (iVar1 == L->ncol)) {
          iVar18 = 5;
          iVar17 = -5;
          if ((-1 < U->nrow) && (U->nrow == U->ncol)) {
            pvVar2 = L->Store;
            lVar3 = *(long *)((long)pvVar2 + 8);
            pvVar4 = U->Store;
            lVar5 = *(long *)((long)pvVar4 + 8);
            local_170 = trans;
            local_168 = L;
            local_160 = U;
            local_158 = floatCalloc((long)iVar1);
            if (local_158 == (float *)0x0) {
              sprintf((char *)&nsupr,"%s at line %d in file %s\n",
                      "Malloc fails for work in sp_strsv().",0x7f,
                      "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c"
                     );
              superlu_abort_and_exit((char *)&nsupr);
            }
            if (*local_170 == 'N') {
              if (*uplo == 'L') {
                if (local_168->nrow == 0) {
                  return 0;
                }
                local_148 = lVar3 + 4;
                pSVar13 = (SuperMatrix *)0x0;
                pfVar15 = local_158;
                fVar20 = 0.0;
                while ((long)pSVar13 <= (long)*(int *)((long)pvVar2 + 4)) {
                  iVar18 = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)pSVar13 * 4);
                  lVar5 = (long)iVar18;
                  iVar17 = *(int *)(*(long *)((long)pvVar2 + 0x20) + lVar5 * 4);
                  lVar9 = (long)iVar17;
                  iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x20) + 4 + lVar5 * 4);
                  nsupr = iVar1 - iVar17;
                  pSVar14 = (SuperMatrix *)((long)&pSVar13->Stype + 1);
                  iVar18 = *(int *)(*(long *)((long)pvVar2 + 0x30) + 4 + (long)pSVar13 * 4) - iVar18
                  ;
                  uVar19 = nsupr - iVar18;
                  lVar11 = (long)*(int *)(*(long *)((long)pvVar2 + 0x10) + lVar5 * 4);
                  fVar20 = (float)(int)(iVar18 * uVar19 * 2) +
                           fVar20 + (float)((iVar18 + -1) * iVar18);
                  nsupc = iVar18;
                  if (iVar18 == 1) {
                    pfVar8 = (float *)(local_148 + lVar11 * 4);
                    while (lVar9 = lVar9 + 1, pSVar13 = pSVar14, lVar9 < iVar1) {
                      iVar18 = *(int *)(*(long *)((long)pvVar2 + 0x18) + lVar9 * 4);
                      x[iVar18] = x[iVar18] - x[lVar5] * *pfVar8;
                      pfVar8 = pfVar8 + 1;
                    }
                  }
                  else {
                    local_170 = (char *)CONCAT44(local_170._4_4_,fVar20);
                    local_168 = (SuperMatrix *)(x + lVar5);
                    local_160 = pSVar14;
                    local_14c = nsupr;
                    local_140 = lVar11;
                    slsolve(nsupr,iVar18,(float *)(lVar3 + lVar11 * 4),(float *)local_168);
                    smatvec(local_14c,uVar19,iVar18,
                            (float *)(lVar3 + (long)((int)local_140 + iVar18) * 4),
                            (float *)local_168,local_158);
                    if ((int)uVar19 < 1) {
                      uVar19 = 0;
                    }
                    for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
                      iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)(iVar17 + iVar18) * 4
                                      + uVar7 * 4);
                      x[iVar1] = x[iVar1] - local_158[uVar7];
                      local_158[uVar7] = 0.0;
                    }
                    pSVar13 = local_160;
                    pfVar15 = local_158;
                    fVar20 = local_170._0_4_;
                  }
                }
              }
              else {
                if (local_160->nrow == 0) {
                  return 0;
                }
                fVar20 = 0.0;
                for (uVar19 = *(uint *)((long)pvVar2 + 4); pfVar15 = local_158, -1 < (int)uVar19;
                    uVar19 = uVar19 - 1) {
                  uVar7 = (ulong)uVar19;
                  iVar18 = *(int *)(*(long *)((long)pvVar2 + 0x30) + uVar7 * 4);
                  lVar9 = (long)iVar18;
                  nsupr = *(int *)(*(long *)((long)pvVar2 + 0x20) + 4 + lVar9 * 4) -
                          *(int *)(*(long *)((long)pvVar2 + 0x20) + lVar9 * 4);
                  nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + 4 + uVar7 * 4) - iVar18;
                  fVar20 = fVar20 + (float)((nsupc + 1) * nsupc);
                  pfVar15 = (float *)(lVar3 + (long)*(int *)(*(long *)((long)pvVar2 + 0x10) +
                                                            lVar9 * 4) * 4);
                  if (nsupc == 1) {
                    x[lVar9] = x[lVar9] / *pfVar15;
                    iVar18 = *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar9 * 4);
                    for (lVar11 = (long)*(int *)(*(long *)((long)pvVar4 + 0x18) + lVar9 * 4);
                        lVar11 < iVar18; lVar11 = lVar11 + 1) {
                      iVar17 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar11 * 4);
                      x[iVar17] = x[iVar17] - x[lVar9] * *(float *)(lVar5 + lVar11 * 4);
                    }
                  }
                  else {
                    local_160 = (SuperMatrix *)CONCAT44(local_160._4_4_,uVar19);
                    local_168 = (SuperMatrix *)(uVar7 + 1);
                    local_170 = (char *)CONCAT44(local_170._4_4_,fVar20);
                    susolve(nsupr,nsupc,pfVar15,x + lVar9);
                    iVar18 = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_168 * 4);
                    fVar20 = local_170._0_4_;
                    while (lVar9 < iVar18) {
                      iVar17 = *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar9 * 4);
                      iVar1 = *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar9 * 4);
                      for (lVar11 = (long)iVar1; lVar11 < iVar17; lVar11 = lVar11 + 1) {
                        iVar12 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar11 * 4);
                        x[iVar12] = x[iVar12] - x[lVar9] * *(float *)(lVar5 + lVar11 * 4);
                      }
                      fVar20 = fVar20 + (float)((iVar17 - iVar1) * 2);
                      lVar9 = lVar9 + 1;
                    }
                    uVar19 = (uint)local_160;
                  }
                }
              }
            }
            else if (*uplo == 'L') {
              if (local_168->nrow == 0) {
                return 0;
              }
              fVar20 = 0.0;
              uVar19 = *(uint *)((long)pvVar2 + 4);
              while (pfVar15 = local_158, -1 < (int)uVar19) {
                lVar5 = *(long *)((long)pvVar2 + 0x30);
                local_160 = (SuperMatrix *)CONCAT44(local_160._4_4_,uVar19);
                uVar7 = (ulong)uVar19;
                iVar18 = *(int *)(lVar5 + uVar7 * 4);
                lVar11 = (long)iVar18;
                iVar17 = *(int *)(*(long *)((long)pvVar2 + 0x20) + lVar11 * 4);
                nsupr = *(int *)(*(long *)((long)pvVar2 + 0x20) + 4 + lVar11 * 4) - iVar17;
                nsupc = *(int *)(lVar5 + 4 + uVar7 * 4) - iVar18;
                lVar9 = *(long *)((long)pvVar2 + 0x10);
                iVar18 = *(int *)(lVar9 + lVar11 * 4);
                local_168 = (SuperMatrix *)(long)iVar18;
                iVar1 = *(int *)(lVar5 + 4 + uVar7 * 4);
                lVar5 = lVar11;
                while (lVar6 = lVar5, lVar6 < iVar1) {
                  iVar12 = iVar18 + nsupc;
                  iVar18 = *(int *)(lVar9 + 4 + lVar6 * 4);
                  lVar16 = (long)(iVar17 + nsupc);
                  for (lVar10 = (long)iVar12; lVar5 = lVar6 + 1, lVar10 < iVar18;
                      lVar10 = lVar10 + 1) {
                    x[lVar6] = x[lVar6] -
                               x[*(int *)(*(long *)((long)pvVar2 + 0x18) + lVar16 * 4)] *
                               *(float *)(lVar3 + lVar10 * 4);
                    lVar16 = lVar16 + 1;
                  }
                }
                fVar20 = fVar20 + (float)((nsupr - nsupc) * nsupc * 2);
                if (1 < nsupc) {
                  local_170 = (char *)CONCAT44(local_170._4_4_,
                                               fVar20 + (float)((nsupc + -1) * nsupc));
                  strsv_("L","T","U",&nsupc,(real *)(lVar3 + (long)local_168 * 4),&nsupr,x + lVar11,
                         &incx);
                  fVar20 = local_170._0_4_;
                }
                uVar19 = (uint)local_160 - 1;
              }
            }
            else {
              if (local_160->nrow == 0) {
                return 0;
              }
              lVar9 = 0;
              fVar20 = 0.0;
              while (pfVar15 = local_158, lVar9 <= *(int *)((long)pvVar2 + 4)) {
                lVar11 = *(long *)((long)pvVar2 + 0x30);
                iVar18 = *(int *)(lVar11 + lVar9 * 4);
                lVar6 = (long)iVar18;
                nsupr = *(int *)(*(long *)((long)pvVar2 + 0x20) + 4 + lVar6 * 4) -
                        *(int *)(*(long *)((long)pvVar2 + 0x20) + lVar6 * 4);
                nsupc = *(int *)(lVar11 + 4 + lVar9 * 4) - iVar18;
                iVar18 = *(int *)(*(long *)((long)pvVar2 + 0x10) + lVar6 * 4);
                iVar17 = *(int *)(lVar11 + 4 + lVar9 * 4);
                lVar11 = lVar6;
                while (lVar11 < iVar17) {
                  iVar1 = *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + lVar11 * 4);
                  iVar12 = *(int *)(*(long *)((long)pvVar4 + 0x18) + lVar11 * 4);
                  for (lVar16 = (long)iVar12; lVar16 < iVar1; lVar16 = lVar16 + 1) {
                    x[lVar11] = x[lVar11] -
                                x[*(int *)(*(long *)((long)pvVar4 + 0x10) + lVar16 * 4)] *
                                *(float *)(lVar5 + lVar16 * 4);
                  }
                  fVar20 = fVar20 + (float)((iVar1 - iVar12) * 2);
                  lVar11 = lVar11 + 1;
                }
                fVar20 = fVar20 + (float)((nsupc + 1) * nsupc);
                a = (real *)(lVar3 + (long)iVar18 * 4);
                if (nsupc == 1) {
                  x[lVar6] = x[lVar6] / *a;
                  lVar9 = lVar9 + 1;
                }
                else {
                  local_170 = (char *)CONCAT44(local_170._4_4_,fVar20);
                  strsv_("U","T","N",&nsupc,a,&nsupr,x + lVar6,&incx);
                  lVar9 = lVar9 + 1;
                  fVar20 = local_170._0_4_;
                }
              }
            }
            stat->ops[0x11] = fVar20 + stat->ops[0x11];
            superlu_free(pfVar15);
            return 0;
          }
        }
      }
      else {
        iVar18 = 3;
        iVar17 = -3;
      }
    }
  }
  else {
    iVar18 = 1;
    iVar17 = -1;
  }
  *info = iVar17;
  nsupr = iVar18;
  input_error("sp_strsv",&nsupr);
  return 0;
}

Assistant:

int
sp_strsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, float *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    float   *Lval, *Uval;
    int incx = 1, incy = 1;
    float alpha = 1.0, beta = 1.0;
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    float *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_strsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = floatCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_strsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

	        solve_ops += nsupc * (nsupc - 1);
	        solve_ops += 2 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			x[irow] -= x[fsupc] * Lval[luptr];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    SGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    strsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    sgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    slsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    smatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			x[irow] -= work[i];	/* Scatter */
			work[i] = 0.0;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
    	        solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			x[irow] -= x[fsupc] * Uval[i];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    strsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    susolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			    x[irow] -= x[jcol] * Uval[i];
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 2 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			x[jcol] -= x[irow] * Lval[i];
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    strsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			x[jcol] -= x[irow] * Uval[i];
		    }
		}

		solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    strsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}